

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash_test.cc
# Opt level: O1

unique_ptr<char[],_std::default_delete<char[]>_> anon_unknown.dwarf_799b06::RandString(void)

{
  int iVar1;
  void *__s;
  uint uVar2;
  __uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true> in_RDI;
  ulong uVar3;
  
  iVar1 = rand();
  uVar3 = (ulong)(iVar1 % 3 + 2);
  __s = operator_new__(uVar3);
  memset(__s,0,uVar3);
  *(void **)in_RDI.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
            super__Head_base<0UL,_char_*,_false>._M_head_impl = __s;
  uVar2 = iVar1 % 3 + 1;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      iVar1 = rand();
      *(byte *)((long)__s + uVar3) = (byte)iVar1 & 7 | 0x30;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  *(undefined1 *)((long)__s + (ulong)uVar2) = 0;
  return (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         (tuple<char_*,_std::default_delete<char[]>_>)
         in_RDI.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<char[]> RandString(void) {
  unsigned len = 1 + (rand() % 3);
  auto ret = std::make_unique<char[]>(len + 1);

  for (unsigned i = 0; i < len; i++) {
    ret[i] = '0' + (rand() & 7);
  }
  ret[len] = 0;

  return ret;
}